

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_math.c
# Opt level: O0

int SUNRCompareTol(sunrealtype a,sunrealtype b,sunrealtype tol)

{
  undefined8 local_48;
  undefined8 local_38;
  sunrealtype norm;
  sunrealtype diff;
  sunrealtype tol_local;
  sunrealtype b_local;
  sunrealtype a_local;
  undefined4 local_4;
  
  if ((a != b) || (NAN(a) || NAN(b))) {
    if (1.79769313486232e+308 <= ABS(a + b)) {
      local_38 = 1.79769313486232e+308;
    }
    else {
      local_38 = ABS(a + b);
    }
    if (2.220446049250313e-15 <= tol * local_38) {
      local_48 = tol * local_38;
    }
    else {
      local_48 = 2.220446049250313e-15;
    }
    local_4 = (uint)((ABS(a - b) < local_48 ^ 0xffU) & 1);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

sunbooleantype SUNRCompareTol(sunrealtype a, sunrealtype b, sunrealtype tol)
{
  sunrealtype diff;
  sunrealtype norm;

  /* If a and b are exactly equal.
   * This also covers the case where a and b are both inf under IEEE 754.
   */
  if (a == b) { return (SUNFALSE); }

  diff = SUNRabs(a - b);
  norm = SUNMIN(SUNRabs(a + b), SUN_BIG_REAL);

  /* When |a + b| is very small (less than 10*SUN_UNIT_ROUNDOFF) or zero, we use
   * an absolute difference:
   *    |a - b| >= 10*SUN_UNIT_ROUNDOFF
   * Otherwise we use a relative difference:
   *    |a - b| < tol * |a + b|
   * The choice to use |a + b| over max(a, b) is arbitrary, as is the choice to
   * use 10*SUN_UNIT_ROUNDOFF.
   * 
   * In order to handle NANs correctly without explicit checks of isnan or
   * isunordered (which throw warnings for some compilers and flags), we use
   * !isless. The seemingly equivalent >= can have undefined behavior for NANs.
   */
  return !isless(diff, SUNMAX(10 * SUN_UNIT_ROUNDOFF, tol * norm));
}